

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_getfield(lua_State *L,int idx,char *k)

{
  StkId pSVar1;
  TValue *t;
  TString *key;
  TValue *slot;
  
  t = index2value(L,idx);
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    slot = luaH_getstr((Table *)(t->value_).gc,key);
    if ((slot->tt_ & 0xf) != 0) {
      pSVar1 = (L->top).p;
      (pSVar1->val).value_ = slot->value_;
      (pSVar1->val).tt_ = slot->tt_;
      (L->top).p = (StkId)((L->top).offset + 0x10);
      goto LAB_001057bf;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = key;
  (pSVar1->val).tt_ = key->tt | 0x40;
  pSVar1 = (L->top).p;
  (L->top).p = pSVar1 + 1;
  luaV_finishget(L,t,&pSVar1->val,pSVar1,slot);
LAB_001057bf:
  return *(byte *)((L->top).offset + -8) & 0xf;
}

Assistant:

LUA_API int lua_getfield (lua_State *L, int idx, const char *k) {
  lua_lock(L);
  return auxgetstr(L, index2value(L, idx), k);
}